

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirent.cpp
# Opt level: O2

DIR * __thiscall pstore::romfs::dirent::opendir(dirent *this,char *__name)

{
  error_code eVar1;
  error_code erc;
  directory *local_30;
  error_or<const_pstore::romfs::directory_*> local_28;
  
  if ((*(int *)(__name + 0x18) == 1) && (*(long *)(__name + 0x10) == 8)) {
    local_30 = *(directory **)(__name + 8);
    error_or<pstore::romfs::directory_const*>::error_or<pstore::romfs::directory_const*,void>
              ((error_or<pstore::romfs::directory_const*> *)&local_28,&local_30);
  }
  else {
    eVar1 = make_error_code(enotdir);
    erc._M_cat = eVar1._M_cat;
    erc._4_4_ = 0;
    erc._M_value = eVar1._M_value;
    error_or<const_pstore::romfs::directory_*>::error_or(&local_28,erc);
  }
  error_or<pstore::gsl::not_null<pstore::romfs::directory_const*>>::
  error_or<pstore::romfs::directory_const*,void>
            ((error_or<pstore::gsl::not_null<const_pstore::romfs::directory_*>_> *)this,&local_28);
  error_or<const_pstore::romfs::directory_*>::~error_or(&local_28);
  return (DIR *)this;
}

Assistant:

auto pstore::romfs::dirent::opendir () const -> error_or<gsl::not_null<class directory const *>> {
    // NOLINTNEXTLINE (bugprone-sizeof-expression)
    if (!is_directory () || stat_.size != sizeof (directory const *)) {
        return error_or<directory const *> (make_error_code (error_code::enotdir));
    }
    return error_or<directory const *> (reinterpret_cast<directory const *> (contents_.get ()));
}